

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_math.hpp
# Opt level: O2

int32_t trng::int_math::modulo_helper<2147462579,_0>::modulo(uint64_t x)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  
  uVar3 = (x >> 0x1f) * -0x7fffadb3 + x;
  uVar3 = (uVar3 >> 0x1f) * -0x7fffadb3 + uVar3;
  iVar1 = (int)uVar3;
  iVar2 = iVar1 + -0x7fffadb3;
  if (uVar3 < 0x7fffadb3) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

TRNG_CUDA_ENABLE
      static int32_t modulo(uint64_t x) {
        if (mask == m) {
          uint32_t y{static_cast<uint32_t>((x & mask) + (x >> e))};
          if (y >= m)
            y -= m;
          return y;
        }
        if (static_cast<int64_t>(k) * (static_cast<int64_t>(k) + 2) <= m) {
          x = (x & mask) + (x >> e) * k;
          x = (x & mask) + (x >> e) * k;
          if (x >= m)
            x -= m;
          return static_cast<int32_t>(x);
        }
        return static_cast<int32_t>(x % m);
      }